

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::BooleanBitVectorFunction::eval
          (BooleanBitVectorFunction *this,EvalContext *context,Args *args,SourceRange range,
          SystemCallInfo *param_5)

{
  undefined1 uVar1;
  bool bVar2;
  bitwidth_t bVar3;
  SVInt *this_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  long in_RSI;
  ConstantValue *in_RDI;
  SVInt *iv;
  ConstantValue value;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  bitwidth_t bits;
  undefined7 in_stack_fffffffffffffef8;
  EvalContext *in_stack_ffffffffffffff20;
  ConstantValue *in_stack_ffffffffffffff28;
  SourceRange in_stack_ffffffffffffff30;
  
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval((Expression *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   (EvalContext *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  Bitstream::convertToBitVector
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,in_stack_ffffffffffffff20);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xadbcb0);
  uVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xadbcbd);
  if ((bool)uVar1) {
    this_00 = slang::ConstantValue::integer((ConstantValue *)0xadbd39);
    bits = *(bitwidth_t *)(in_RSI + 0x38);
    if (bits == 0) {
      SVInt::countOnes((SVInt *)CONCAT17(uVar1,in_stack_fffffffffffffef8));
      SVInt::SVInt(this_00,bits,CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (bool)in_stack_fffffffffffffedf);
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (SVInt *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      SVInt::~SVInt(this_00);
    }
    else if (bits == 1) {
      bVar3 = SVInt::countOnes((SVInt *)CONCAT17(uVar1,in_stack_fffffffffffffef8));
      SVInt::SVInt(this_00,bits,CONCAT44(bVar3,in_stack_fffffffffffffee0),
                   (bool)in_stack_fffffffffffffedf);
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)CONCAT44(bVar3,in_stack_fffffffffffffee0),
                 (SVInt *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      SVInt::~SVInt(this_00);
    }
    else {
      bVar2 = SVInt::hasUnknown(this_00);
      uVar4 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffee0);
      SVInt::SVInt(this_00,bits,CONCAT44(in_stack_fffffffffffffee4,uVar4),
                   (bool)in_stack_fffffffffffffedf);
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)CONCAT44(in_stack_fffffffffffffee4,uVar4),
                 (SVInt *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      SVInt::~SVInt(this_00);
    }
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (nullptr_t)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xadbef4);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange range,
                       const CallExpression::SystemCallInfo&) const final {
        auto value = Bitstream::convertToBitVector(args[0]->eval(context), range, context);
        if (!value)
            return nullptr;

        const SVInt& iv = value.integer();
        switch (kind) {
            case OneHot:
                return SVInt(1, uint64_t(iv.countOnes() == 1), false);
            case OneHot0:
                return SVInt(1, uint64_t(iv.countOnes() <= 1), false);
            case IsUnknown:
                return SVInt(1, uint64_t(iv.hasUnknown()), false);
        }
        SLANG_UNREACHABLE;
    }